

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginTabItem(char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImGuiTabBar *tab_bar;
  bool bVar1;
  
  if (GImGui->CurrentWindow->SkipItems == false) {
    tab_bar = GImGui->CurrentTabBar;
    if (tab_bar == (ImGuiTabBar *)0x0) {
      __assert_fail("(tab_bar) && \"Needs to be called between BeginTabBar() and EndTabBar()!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                    ,0x1d52,"bool ImGui::BeginTabItem(const char *, bool *, ImGuiTabItemFlags)");
    }
    if (((uint)flags >> 0x15 & 1) != 0) {
      __assert_fail("!(flags & ImGuiTabItemFlags_Button)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                    ,0x1d55,"bool ImGui::BeginTabItem(const char *, bool *, ImGuiTabItemFlags)");
    }
    bVar1 = TabItemEx(tab_bar,label,p_open,flags);
    if ((char)((flags & 8U) >> 3) == '\0' && bVar1) {
      ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,(int)tab_bar->LastTabItemIdx);
      PushOverrideID(0);
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool    ImGui::BeginTabItem(const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar, "Needs to be called between BeginTabBar() and EndTabBar()!");
        return false;
    }
    IM_ASSERT(!(flags & ImGuiTabItemFlags_Button)); // BeginTabItem() Can't be used with button flags, use TabItemButton() instead!

    bool ret = TabItemEx(tab_bar, label, p_open, flags);
    if (ret && !(flags & ImGuiTabItemFlags_NoPushId))
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
        PushOverrideID(tab->ID); // We already hashed 'label' so push into the ID stack directly instead of doing another hash through PushID(label)
    }
    return ret;
}